

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_parse.c
# Opt level: O2

void l2_absorb_stmt_var_def_list1(void)

{
  boolean bVar1;
  l2_token *plVar2;
  
  while( true ) {
    bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_COMMA);
    if (bVar1 == '\0') {
      return;
    }
    l2_parse_token_forward();
    bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_IDENTIFIER);
    l2_parse_token_forward();
    if (bVar1 == '\0') break;
    bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_ASSIGN);
    if (bVar1 != '\0') {
      l2_parse_token_forward();
      l2_absorb_expr_assign();
    }
  }
  plVar2 = l2_parse_token_current();
  l2_parsing_error(L2_PARSING_ERROR_UNEXPECTED_TOKEN,plVar2->current_line,plVar2->current_col,plVar2
                  );
}

Assistant:

_if_type (L2_TOKEN_COMMA) /* , */
    {
        _if_type (L2_TOKEN_IDENTIFIER) /* id */
        {
            _if_type (L2_TOKEN_ASSIGN) /* = */
            {
                l2_absorb_expr_assign(); /* expr_assign */
            }
            _else /* without initialization */
            {

            }

            /* absorb last part of definition list in recursion */
            l2_absorb_stmt_var_def_list1();

        } _throw_unexpected_token

    } _end
}